

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall QScrollerPrivate::recalcScrollingSegments(QScrollerPrivate *this,bool forceRecalc)

{
  QScroller *this_00;
  bool bVar1;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QPointF QVar2;
  QPointF local_48;
  QPointF local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->q_ptr;
  local_30 = QScroller::pixelPerMeter(this_00);
  QVar2 = QScroller::velocity(this_00);
  this->releaseVelocity = QVar2;
  if ((int)CONCAT71(in_register_00000031,forceRecalc) == 0) {
    bVar1 = scrollingSegmentsValid(this,Horizontal);
    if (bVar1) {
      bVar1 = scrollingSegmentsValid(this,Vertical);
      if (bVar1) goto LAB_005d9e8f;
    }
  }
  local_48.xp = (this->overshootPosition).xp + (this->contentPosition).xp;
  local_48.yp = (this->overshootPosition).yp + (this->contentPosition).yp;
  createScrollingSegments(this,&this->releaseVelocity,&local_48,&local_30);
LAB_005d9e8f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::recalcScrollingSegments(bool forceRecalc)
{
    Q_Q(QScroller);
    QPointF ppm = q->pixelPerMeter();

    releaseVelocity = q->velocity();

    if (forceRecalc ||
        !scrollingSegmentsValid(Qt::Horizontal) ||
        !scrollingSegmentsValid(Qt::Vertical))
        createScrollingSegments(releaseVelocity, contentPosition + overshootPosition, ppm);
}